

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_serial_unix.cxx
# Opt level: O0

int ndiSerialCheckDSR(int serial_port)

{
  int iVar1;
  uint local_14;
  int local_10;
  int bits;
  int serial_port_local;
  
  local_10 = serial_port;
  iVar1 = ioctl(serial_port,0x5415,&local_14);
  if (iVar1 < 0) {
    bits = 1;
  }
  else {
    bits = (int)((local_14 & 0x100) != 0);
  }
  return bits;
}

Assistant:

ndicapiExport int ndiSerialCheckDSR(int serial_port)
{
#if defined(linux) || defined(__linux__)
  int bits;
  /* get the bits to see if DSR is set (i.e. if device is connected) */
  if (ioctl(serial_port, TIOCMGET, &bits) >= 0)
  {
    return ((bits & TIOCM_DSR) != 0);
  }
#endif
  /* if called failed for any reason, return success for robustness */
  return 1;
}